

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetDirectoryPropertyCommand::InitialPass
          (cmGetDirectoryPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *name;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar6;
  string *psVar7;
  PolicyID id;
  pointer pcVar8;
  string sd;
  string local_70;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name) < 0x21) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
LAB_0020d7bf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  psVar7 = name + 1;
  pcVar6 = (this->super_cmCommand).Makefile;
  iVar3 = std::__cxx11::string::compare((char *)psVar7);
  if (iVar3 == 0) {
    psVar7 = name + 2;
    if (psVar7 == (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"DIRECTORY argument provided without subsequent arguments","");
      cmCommand::SetError(&this->super_cmCommand,&local_70);
      goto LAB_0020d7bf;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar8 = name[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar8,pcVar8 + name[2]._M_string_length);
    bVar2 = cmsys::SystemTools::FileIsFullPath(&local_70);
    if (!bVar2) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::_M_assign((string *)&local_70);
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)name[2]._M_dataplus._M_p);
    }
    cmsys::SystemTools::CollapseFullPath(&local_50,&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar6 = cmGlobalGenerator::FindMakefile(this_00,&local_70);
    if (pcVar6 == (cmMakefile *)0x0) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,"");
      cmCommand::SetError(&this->super_cmCommand,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      psVar7 = name + 3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (pcVar6 == (cmMakefile *)0x0) {
      return false;
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)psVar7);
  if (iVar3 == 0) {
    if (psVar7 + 1 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "A request for a variable definition was made without providing the name of the variable to get."
                 ,"");
      cmCommand::SetError(&this->super_cmCommand,&local_70);
      goto LAB_0020d7bf;
    }
    psVar7 = cmMakefile::GetSafeDefinition(pcVar6,psVar7 + 1);
    pcVar6 = (this->super_cmCommand).Makefile;
    pcVar8 = (psVar7->_M_dataplus)._M_p;
    goto LAB_0020d9f6;
  }
  if (psVar7->_M_string_length == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar3 == 0) {
      PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0059,false);
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0020d834;
        pcVar6 = (this->super_cmCommand).Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)0x3b,id);
        cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = cmMakefile::GetDefineFlagsCMP0059((this->super_cmCommand).Makefile);
    }
    else {
LAB_0020d834:
      pcVar5 = cmMakefile::GetProperty(pcVar6,psVar7);
    }
  }
  pcVar6 = (this->super_cmCommand).Makefile;
  pcVar8 = "";
  if (pcVar5 != (char *)0x0) {
    pcVar8 = pcVar5;
  }
LAB_0020d9f6:
  cmMakefile::AddDefinition(pcVar6,name,pcVar8);
  return true;
}

Assistant:

bool cmGetDirectoryPropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string const& variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile* dir = this->Makefile;
  if (*i == "DIRECTORY") {
    ++i;
    if (i == args.end()) {
      this->SetError(
        "DIRECTORY argument provided without subsequent arguments");
      return false;
    }
    std::string sd = *i;
    // make sure the start dir is a full path
    if (!cmSystemTools::FileIsFullPath(sd)) {
      sd = this->Makefile->GetCurrentSourceDirectory();
      sd += "/";
      sd += *i;
    }

    // The local generators are associated with collapsed paths.
    sd = cmSystemTools::CollapseFullPath(sd);

    // lookup the makefile from the directory name
    dir = this->Makefile->GetGlobalGenerator()->FindMakefile(sd);
    if (!dir) {
      this->SetError(
        "DIRECTORY argument provided but requested directory not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
    ++i;
  }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if (*i == "DEFINITION") {
    ++i;
    if (i == args.end()) {
      this->SetError("A request for a variable definition was made without "
                     "providing the name of the variable to get.");
      return false;
    }
    std::string const& output = dir->GetSafeDefinition(*i);
    this->Makefile->AddDefinition(variable, output.c_str());
    return true;
  }

  const char* prop = nullptr;
  if (!i->empty()) {
    if (*i == "DEFINITIONS") {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0059)) {
        case cmPolicies::WARN:
          this->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          this->StoreResult(variable, this->Makefile->GetDefineFlagsCMP0059());
          return true;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
      }
    }
    prop = dir->GetProperty(*i);
  }
  this->StoreResult(variable, prop);
  return true;
}